

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info.cpp
# Opt level: O0

void test(void)

{
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var1;
  ostream *poVar2;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var4;
  undefined1 local_14 [8];
  tuple<int,_int,_int> info;
  
  get_running_sleeping_total_threads();
  p_Var1 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)local_14);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*p_Var1);
  poVar2 = std::operator<<(poVar2,",");
  p_Var3 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)local_14);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var3);
  poVar2 = std::operator<<(poVar2,",");
  p_Var4 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)local_14);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void test() {
    auto info = get_running_sleeping_total_threads();
    std::cout << std::get<0>(info) << "," << std::get<1>(info)
        << "," << std::get<2>(info) << std::endl;
}